

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::EndListValue
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *this,idx_t row_idx)

{
  long lVar1;
  
  lVar1 = (ulong)(*(long *)(this->args + 8) - *(long *)this->args != 0x68) * 0x48;
  if (**(long **)(&this->field_0x8 + lVar1) != 0) {
    row_idx = (idx_t)*(uint *)(**(long **)(&this->field_0x8 + lVar1) + row_idx * 4);
  }
  return (TYPE)*(int64_t *)(*(long *)(&this->field_0x10 + lVar1) + row_idx * 8);
}

Assistant:

typename OP::TYPE EndListValue(idx_t row_idx) {
		idx_t vdata_idx = args.ColumnCount() == 1 ? 0 : 1;
		auto data = (typename OP::TYPE *)vdata[vdata_idx].data;
		auto idx = vdata[vdata_idx].sel->get_index(row_idx);
		return data[idx];
	}